

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::
BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::set(BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      *this,ConfigData *obj,string *stringValue)

{
  undefined8 in_RSI;
  string *in_RDI;
  type value;
  string *this_00;
  string local_38 [40];
  undefined8 local_10;
  
  this_00 = local_38;
  local_10 = in_RSI;
  std::__cxx11::string::string(this_00);
  convertInto((string *)this_00,in_RDI);
  (**(code **)(in_RDI + 8))(local_10,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

virtual void set( C& obj, std::string const& stringValue ) const {
                typename RemoveConstRef<T>::type value;
                convertInto( stringValue, value );
                function( obj, value );
            }